

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintTwoGenericBoxed.cpp
# Opt level: O3

void __thiscall
chrono::ChConstraintTwoGenericBoxed::ArchiveOUT
          (ChConstraintTwoGenericBoxed *this,ChArchiveOut *marchive)

{
  char *local_38;
  double *local_30;
  undefined1 local_28;
  
  ChArchiveOut::VersionWrite<chrono::ChConstraintTwoGenericBoxed>(marchive);
  ChConstraintTwoGeneric::ArchiveOUT(&this->super_ChConstraintTwoGeneric,marchive);
  local_30 = &this->l_min;
  local_38 = "l_min";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_30 = &this->l_max;
  local_38 = "l_max";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  return;
}

Assistant:

void ChConstraintTwoGenericBoxed::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChConstraintTwoGenericBoxed>();

    // serialize the parent class data too
    ChConstraintTwoGeneric::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(l_min);
    marchive << CHNVP(l_max);
}